

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O2

void __thiscall HighsSimplexAnalysis::reportFactorTimer(HighsSimplexAnalysis *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  HighsTimer *pHVar4;
  pointer pHVar5;
  pointer piVar6;
  pointer pdVar7;
  ulong uVar8;
  uint uVar9;
  undefined4 extraout_var;
  ulong uVar10;
  HighsInt clock_id;
  long lVar11;
  ulong uVar12;
  long lVar13;
  FactorTimer factor_timer;
  HighsTimerClock all_factor_clocks;
  FactorTimer local_59;
  ulong local_58;
  HighsTimerClock local_50;
  
  uVar9 = ::highs::parallel::num_threads();
  local_58 = CONCAT44(extraout_var,uVar9);
  uVar10 = 0;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)uVar9;
  }
  lVar13 = 0;
  for (uVar12 = 0; uVar8 = local_58, uVar10 != uVar12; uVar12 = uVar12 + 1) {
    printf("reportFactorTimer: HFactor clocks for thread %d / %d\n",uVar12 & 0xffffffff,
           (ulong)(uVar9 - 1));
    FactorTimer::reportFactorClock
              (&local_59,
               (HighsTimerClock *)
               ((long)&((this->thread_factor_clocks).
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_start)->timer_pointer_ + lVar13));
    lVar13 = lVar13 + 0x20;
  }
  if (1 < (int)local_58) {
    pHVar4 = ((this->thread_factor_clocks).
              super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
              super__Vector_impl_data._M_start)->timer_pointer_;
    local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_50.timer_pointer_ = pHVar4;
    FactorTimer::initialiseFactorClocks(&local_59,&local_50);
    pHVar5 = (this->thread_factor_clocks).
             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pHVar4->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pHVar4->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar10 = 0; uVar10 != (uVar8 & 0xffffffff); uVar10 = uVar10 + 1) {
      lVar13 = *(long *)&pHVar5[uVar10].clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl
      ;
      for (lVar11 = 0; lVar11 != 0x27; lVar11 = lVar11 + 1) {
        iVar2 = local_50.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar11];
        iVar3 = *(int *)(lVar13 + lVar11 * 4);
        piVar1 = piVar6 + iVar2;
        *piVar1 = *piVar1 + piVar6[iVar3];
        pdVar7[iVar2] = pdVar7[iVar3] + pdVar7[iVar2];
      }
    }
    printf("reportFactorTimer: HFactor clocks for all %d threads\n",uVar8 & 0xffffffff);
    FactorTimer::reportFactorClock(&local_59,&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_50.clock_.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportFactorTimer() {
  assert(analyse_factor_time);
  FactorTimer factor_timer;
  HighsInt max_threads = highs::parallel::num_threads();
  for (HighsInt i = 0; i < max_threads; i++) {
    //  for (HighsTimerClock clock : thread_factor_clocks) {
    printf("reportFactorTimer: HFactor clocks for thread %" HIGHSINT_FORMAT
           " / %" HIGHSINT_FORMAT "\n",
           i, max_threads - 1);
    factor_timer.reportFactorClock(thread_factor_clocks[i]);
  }
  if (max_threads > 1) {
    HighsTimer* timer_pointer = thread_factor_clocks[0].timer_pointer_;
    HighsTimerClock all_factor_clocks;
    all_factor_clocks.timer_pointer_ = timer_pointer;
    vector<HighsInt>& clock = all_factor_clocks.clock_;
    factor_timer.initialiseFactorClocks(all_factor_clocks);
    for (HighsInt i = 0; i < max_threads; i++) {
      vector<HighsInt>& thread_clock = thread_factor_clocks[i].clock_;
      for (HighsInt clock_id = 0; clock_id < FactorNumClock; clock_id++) {
        HighsInt all_factor_iClock = clock[clock_id];
        HighsInt thread_factor_iClock = thread_clock[clock_id];
        timer_pointer->clock_num_call[all_factor_iClock] +=
            timer_pointer->clock_num_call[thread_factor_iClock];
        timer_pointer->clock_time[all_factor_iClock] +=
            timer_pointer->clock_time[thread_factor_iClock];
      }
    }
    printf("reportFactorTimer: HFactor clocks for all %" HIGHSINT_FORMAT
           " threads\n",
           max_threads);
    factor_timer.reportFactorClock(all_factor_clocks);
  }
}